

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_resetthread(lua_State *L,lua_State *th)

{
  ulong uVar1;
  TValue *level;
  uint uVar2;
  uint64_t uVar3;
  void *pvVar4;
  ulong uVar5;
  
  th->dummy_ffid = '\x01';
  th->status = '\0';
  (th->glref).ptr64 = (L->glref).ptr64;
  (th->env).gcptr64 = (L->env).gcptr64;
  th->cframe = (void *)0x0;
  uVar3 = (th->stack).ptr64;
  if (uVar3 != 0) {
    lj_state_relimitstack(th);
    uVar2 = th->stacksize;
    level = (TValue *)(uVar3 + 0x10);
    th->top = level;
    th->base = level;
    lj_func_closeuv(L,level);
    if (2 < (ulong)uVar2) {
      uVar1 = uVar3 + (ulong)uVar2 * 8;
      uVar5 = uVar3 + 0x18;
      if (uVar3 + 0x18 < uVar1) {
        uVar5 = uVar1;
      }
      memset(level,0xff,((uVar5 - uVar3) - 0x11 & 0xfffffffffffffff8) + 8);
    }
  }
  pvVar4 = L->exdata2;
  th->exdata = L->exdata;
  th->exdata2 = pvVar4;
  return;
}

Assistant:

LUA_API void lua_resetthread(lua_State *L, lua_State *th)
{
  TValue *stend, *st;

  th->dummy_ffid = FF_C;
  th->status = LUA_OK;

  setmrefr(th->glref, L->glref);
  setgcrefr(th->env, L->env);

  th->cframe = NULL;

  st = tvref(th->stack);

  if (st != NULL) {
    lj_state_relimitstack(th);

    stend = st + th->stacksize;
    st++; /* Needed for curr_funcisL() on empty stack. */
    if (LJ_FR2) st++;
    th->base = th->top = st;
    lj_func_closeuv(L, st);
    while (st < stend)  /* Clear new slots. */
      setnilV(st++);
  }

  th->exdata = L->exdata;
  th->exdata2 = L->exdata2;
}